

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  pointer pcVar1;
  pointer pcVar2;
  cmState *this_00;
  cmCacheManager *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer pbVar9;
  pointer key;
  CacheIterator CVar10;
  SaveCacheEntry save;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  ostringstream warning;
  undefined1 local_280 [32];
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Alloc_hider local_240;
  char *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Rb_tree_color local_220;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1d8;
  CacheIterator local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_1a8 + 0x10;
  pcVar2 = (var->_M_dataplus)._M_p;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + var->_M_string_length);
  cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1f8,true);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  this_00 = this->State;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  cmState::SetGlobalProperty(this_00,(string *)local_1a8,"");
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar5 = cmState::GetIsInTryCompile(this->State);
  iVar6 = 0;
  if (!bVar5) {
    local_218.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "You have changed variables that require your cache to be deleted.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Configure will be re-run and you may have to reset some variables.\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The following variables have changed:\n",0x26);
    if (local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar9 = local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_260._M_p = (pointer)&local_250;
        local_280._8_8_ = 0;
        local_280[0x10] = '\0';
        local_258 = 0;
        local_250._M_local_buf[0] = '\0';
        local_240._M_p = (pointer)&local_230;
        local_238 = (char *)0x0;
        local_230._M_local_buf[0] = '\0';
        local_280._0_8_ = local_280 + 0x10;
        std::__cxx11::string::_M_assign((string *)local_280);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"= ",2);
        std::__cxx11::string::_M_assign((string *)&local_260);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar9[1]._M_dataplus._M_p,
                            pbVar9[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        pcVar8 = cmCacheManager::GetCacheEntryValue(this->CacheManager,(string *)local_280);
        if (pcVar8 != (char *)0x0) {
          CVar10 = cmCacheManager::GetCacheIterator(this->CacheManager,(char *)local_280._0_8_);
          local_220 = CVar10.Position._M_node._M_node[3]._M_color;
          pcVar3 = this->CacheManager;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"HELPSTRING","");
          local_1b8 = cmCacheManager::GetCacheIterator(pcVar3,(char *)local_280._0_8_);
          pcVar8 = cmCacheManager::CacheIterator::GetProperty(&local_1b8,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = local_238;
          if (pcVar8 != (char *)0x0) {
            strlen(pcVar8);
            std::__cxx11::string::_M_replace((ulong)&local_240,0,pcVar4,(ulong)pcVar8);
          }
        }
        std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::push_back
                  (&local_218,(value_type *)local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_p != &local_230) {
          operator_delete(local_240._M_p,
                          CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_p != &local_250) {
          operator_delete(local_260._M_p,
                          CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
        }
        pbVar9 = pbVar9 + 2;
      } while (pbVar9 != local_1f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar3 = this->CacheManager;
    pcVar8 = cmState::GetBinaryDirectory(this->State);
    std::__cxx11::string::string((string *)local_280,pcVar8,(allocator *)&local_1d8);
    cmCacheManager::DeleteCache(pcVar3,(string *)local_280);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    LoadCache(this);
    for (key = local_218.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl
               .super__Vector_impl_data._M_start;
        key != local_218.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl
               .super__Vector_impl_data._M_finish; key = key + 1) {
      cmCacheManager::AddCacheEntry
                (this->CacheManager,&key->key,(key->value)._M_dataplus._M_p,
                 (key->help)._M_dataplus._M_p,key->type);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_280._0_8_,(char *)0x0);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    iVar6 = 0;
    if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
      bVar5 = cmSystemTools::GetInterruptFlag();
      iVar6 = 0;
      if (!bVar5) {
        iVar6 = Configure(this);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&local_218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return iVar6;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State
      ->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if(this->State->GetIsInTryCompile())
    {
    return 0;
    }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  for(std::vector<std::string>::iterator i = argsSplit.begin();
      i != argsSplit.end(); ++i)
    {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue =
        this->CacheManager->GetCacheEntryValue(save.key);
    if(existingValue)
      {
      save.type = this->CacheManager->GetCacheEntryType(save.key);
      if(const char* help =
            this->CacheManager->GetCacheEntryProperty(save.key, "HELPSTRING"))
        {
        save.help = help;
        }
      }
    saved.push_back(save);
    }

  // remove the cache
  this->CacheManager->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for(std::vector<SaveCacheEntry>::iterator i = saved.begin();
      i != saved.end(); ++i)
    {
    this->AddCacheEntry(i->key, i->value.c_str(),
                        i->help.c_str(), i->type);
    }
  cmSystemTools::Message(warning.str().c_str());
  // avoid reconfigure if there were errors
  if(!cmSystemTools::GetErrorOccuredFlag())
    {
    // re-run configure
    return this->Configure();
    }
  return 0;
}